

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calc_state_machine.hxx
# Opt level: O1

void __thiscall
calc_server::calc_state_machine::create_snapshot_internal
          (calc_state_machine *this,ptr<snapshot> *ss)

{
  int iVar1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  int iVar4;
  const_iterator __position;
  _Rb_tree_header *p_Var5;
  ptr<snapshot_ctx> ctx;
  snapshot_ctx *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  ulong local_38;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->snapshots_lock_);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  local_48 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<calc_server::calc_state_machine::snapshot_ctx,std::allocator<calc_server::calc_state_machine::snapshot_ctx>,std::shared_ptr<nuraft::snapshot>&,std::atomic<long>&>
            (&local_40,&local_48,
             (allocator<calc_server::calc_state_machine::snapshot_ctx> *)&local_38,ss,
             &this->cur_value_);
  local_38 = ((ss->super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             last_log_idx_;
  pmVar2 = std::
           map<unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>_>_>_>
           ::operator[](&this->snapshots_,&local_38);
  (pmVar2->
  super___shared_ptr<calc_server::calc_state_machine::snapshot_ctx,_(__gnu_cxx::_Lock_policy)2>).
  _M_ptr = local_48;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pmVar2->
              super___shared_ptr<calc_server::calc_state_machine::snapshot_ctx,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount,&local_40);
  iVar1 = (int)(this->snapshots_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __position._M_node = (this->snapshots_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(this->snapshots_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node != p_Var5 && 3 < iVar1) {
    iVar4 = 1;
    do {
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>_>_>_>
      ::_M_erase_aux(&(this->snapshots_)._M_t,__position);
      if (iVar1 + -3 <= iVar4) break;
      iVar4 = iVar4 + 1;
      __position._M_node = p_Var3;
    } while ((_Rb_tree_header *)p_Var3 != p_Var5);
  }
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->snapshots_lock_);
  return;
}

Assistant:

void create_snapshot_internal(ptr<snapshot> ss) {
        std::lock_guard<std::mutex> ll(snapshots_lock_);

        // Put into snapshot map.
        ptr<snapshot_ctx> ctx = cs_new<snapshot_ctx>(ss, cur_value_);
        snapshots_[ss->get_last_log_idx()] = ctx;

        // Maintain last 3 snapshots only.
        const int MAX_SNAPSHOTS = 3;
        int num = snapshots_.size();
        auto entry = snapshots_.begin();
        for (int ii = 0; ii < num - MAX_SNAPSHOTS; ++ii) {
            if (entry == snapshots_.end()) break;
            entry = snapshots_.erase(entry);
        }
    }